

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> * __thiscall
Lib::
MappingIterator<STLIterator<std::_Rb_tree_iterator<std::pair<const_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:731:14),_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>
::next(MappingIterator<STLIterator<std::_Rb_tree_iterator<std::pair<const_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:731:14),_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>
       *this)

{
  anon_class_1_0_00000001_for__func *in_RSI;
  pair<const_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>_>
  *in_RDI;
  pair<const_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>_>
  *this_00;
  STLIterator<std::_Rb_tree_iterator<std::pair<const_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>_>_>_>
  *in_stack_ffffffffffffff08;
  
  this_00 = in_RDI;
  STLIterator<std::_Rb_tree_iterator<std::pair<const_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>_>_>_>
  ::next(in_stack_ffffffffffffff08);
  move_if_value<std::pair<const_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>_>,_true>
            (in_RDI);
  std::
  pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>_>
  ::
  pair<const_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>,_true>
            ((pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>_>
              *)this_00,in_RDI);
  anon_class_1_0_00000001_for__func::operator()
            (in_RSI,(pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>_>
                     *)this_00);
  std::
  pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>_>
  ::~pair((pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>_>
           *)this_00);
  std::
  pair<const_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>_>
  ::~pair(this_00);
  std::
  pair<const_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_std::set<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>,_std::less<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>,_std::allocator<std::pair<const_Shell::InductionTemplate_*,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>_>_>_>
  ::~pair(this_00);
  return &this_00->first;
}

Assistant:

inline ResultType next() { return _func(move_if_value<ELEMENT_TYPE(Inner)>(_inner.next())); }